

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O3

void duckdb::BinaryTrimFunction<true,true>(DataChunk *input,ExpressionState *state,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  long lVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar6;
  undefined8 uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  reference vector;
  reference vector_00;
  UnifiedVectorFormat *pUVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  UnifiedVectorFormat *pUVar16;
  idx_t iVar17;
  VectorType VVar18;
  ValidityMask *in_R9;
  idx_t idx_in_entry;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  UnifiedVectorFormat *pUVar22;
  undefined8 *puVar23;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t sVar24;
  anon_struct_16_3_d7536bce_for_pointer aVar25;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  UnifiedVectorFormat ldata;
  idx_t in_stack_fffffffffffffee8;
  idx_t idx;
  UnifiedVectorFormat *local_108;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  unsigned_long local_c8;
  idx_t *local_c0;
  long local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,1);
  vVar1 = *vector;
  vVar2 = *vector_00;
  VVar18 = (VectorType)result;
  if (((byte)vVar1 ^ 2) == 0 && ((byte)vVar2 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar18);
    paVar3 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      aVar25 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)
                          (*(anon_union_16_2_67f50693_for_value **)(vector + 0x20))->pointer,
                          (string_t)
                          (*(anon_union_16_2_67f50693_for_value **)(vector_00 + 0x20))->pointer,
                          in_R9,in_stack_fffffffffffffee8);
      paVar3->pointer = aVar25;
      return;
    }
  }
  else {
    local_108 = *(UnifiedVectorFormat **)(input + 0x18);
    if (((byte)vVar2 ^ 2) == 0 && vVar1 == (value_type)0x0) {
      paVar3 = *(anon_union_16_2_67f50693_for_value **)(vector_00 + 0x20);
      lVar4 = *(long *)(vector + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar18);
        lVar5 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (local_108 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          aVar25 = paVar3->pointer;
          lVar14 = 8;
          do {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + lVar14);
            left_02.value._0_8_ = *(undefined8 *)(lVar4 + -8 + lVar14);
            sVar24 = BinaryLambdaWrapper::
                     Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,left_02,(string_t)aVar25,in_R9,
                                in_stack_fffffffffffffee8);
            *(long *)(lVar5 + -8 + lVar14) = sVar24.value._0_8_;
            *(long *)(lVar5 + lVar14) = sVar24.value._8_8_;
            lVar14 = lVar14 + 0x10;
            local_108 = local_108 + -1;
          } while (local_108 != (UnifiedVectorFormat *)0x0);
          return;
        }
        if (local_108 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        uVar12 = 0;
        pUVar22 = (UnifiedVectorFormat *)0x0;
        do {
          if (*(long *)(result + 0x28) == 0) {
            pUVar9 = pUVar22 + 0x40;
            if (local_108 <= pUVar22 + 0x40) {
              pUVar9 = local_108;
            }
LAB_00734217:
            pUVar16 = pUVar22;
            if (pUVar22 < pUVar9) {
              aVar25 = paVar3->pointer;
              uVar13 = (long)pUVar22 << 4 | 8;
              pUVar16 = pUVar9;
              do {
                left_00.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar13);
                left_00.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar13);
                sVar24 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_00,(string_t)aVar25,in_R9,
                                    (idx_t)pUVar16);
                *(long *)(lVar5 + -8 + uVar13) = sVar24.value._0_8_;
                *(long *)(lVar5 + uVar13) = sVar24.value._8_8_;
                pUVar22 = pUVar22 + 1;
                uVar13 = uVar13 + 0x10;
              } while (pUVar16 != pUVar22);
            }
          }
          else {
            uVar13 = *(ulong *)(*(long *)(result + 0x28) + uVar12 * 8);
            pUVar9 = pUVar22 + 0x40;
            if (local_108 <= pUVar22 + 0x40) {
              pUVar9 = local_108;
            }
            pUVar16 = pUVar9;
            if (uVar13 != 0) {
              if (uVar13 == 0xffffffffffffffff) goto LAB_00734217;
              pUVar16 = pUVar22;
              if (pUVar22 < pUVar9) {
                uVar21 = (long)pUVar22 << 4 | 8;
                uVar19 = 0;
                pUVar16 = pUVar9;
                do {
                  if ((uVar13 >> (uVar19 & 0x3f) & 1) != 0) {
                    left.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar21);
                    left.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar21);
                    sVar24 = BinaryLambdaWrapper::
                             Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,left,
                                        (string_t)paVar3->pointer,in_R9,(idx_t)pUVar16);
                    *(long *)(lVar5 + -8 + uVar21) = sVar24.value._0_8_;
                    *(long *)(lVar5 + uVar21) = sVar24.value._8_8_;
                  }
                  uVar19 = uVar19 + 1;
                  uVar21 = uVar21 + 0x10;
                } while ((long)pUVar9 - (long)pUVar22 != uVar19);
              }
            }
          }
          uVar12 = uVar12 + 1;
          pUVar22 = pUVar16;
          if (uVar12 == (ulong)(local_108 + 0x3f) >> 6) {
            return;
          }
        } while( true );
      }
    }
    else {
      if (((byte)vVar1 ^ 2) != 0 || vVar2 != (value_type)0x0) {
        if (vVar2 == (value_type)0x0 && vVar1 == (value_type)0x0) {
          lVar4 = *(long *)(vector + 0x20);
          lVar5 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar18);
          lVar14 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (result + 0x30),
                     (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (vector + 0x30));
          *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
          FlatVector::VerifyFlatVector(vector_00);
          duckdb::ValidityMask::Combine((ValidityMask *)(result + 0x28),(ulong)(vector_00 + 0x28));
          if (*(long *)(result + 0x28) == 0) {
            if (local_108 != (UnifiedVectorFormat *)0x0) {
              lVar15 = 8;
              do {
                sVar24.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + lVar15);
                sVar24.value._0_8_ = *(undefined8 *)(lVar4 + -8 + lVar15);
                right_06.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + lVar15);
                right_06.value._0_8_ = *(undefined8 *)(lVar5 + -8 + lVar15);
                sVar24 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,sVar24,right_06,in_R9,
                                    in_stack_fffffffffffffee8);
                *(long *)(lVar14 + -8 + lVar15) = sVar24.value._0_8_;
                *(long *)(lVar14 + lVar15) = sVar24.value._8_8_;
                lVar15 = lVar15 + 0x10;
                local_108 = local_108 + -1;
              } while (local_108 != (UnifiedVectorFormat *)0x0);
            }
          }
          else if ((UnifiedVectorFormat *)0x3f < local_108 + 0x3f) {
            pUVar22 = (UnifiedVectorFormat *)0x0;
            uVar12 = 0;
            do {
              lVar15 = *(long *)(result + 0x28);
              if (lVar15 == 0) {
                pUVar9 = pUVar22 + 0x40;
                if (local_108 <= pUVar22 + 0x40) {
                  pUVar9 = local_108;
                }
LAB_0073476e:
                pUVar16 = pUVar22;
                if (pUVar22 < pUVar9) {
                  uVar13 = (long)pUVar22 << 4 | 8;
                  do {
                    left_04.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar13);
                    left_04.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar13);
                    right_03.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar13);
                    right_03.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar13);
                    sVar24 = BinaryLambdaWrapper::
                             Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,left_04,right_03,in_R9,
                                        (idx_t)pUVar9);
                    *(long *)(lVar14 + -8 + uVar13) = sVar24.value._0_8_;
                    *(long *)(lVar14 + uVar13) = sVar24.value._8_8_;
                    pUVar22 = pUVar22 + 1;
                    uVar13 = uVar13 + 0x10;
                    pUVar16 = pUVar9;
                  } while (pUVar9 != pUVar22);
                }
              }
              else {
                uVar13 = *(ulong *)(lVar15 + uVar12 * 8);
                pUVar9 = pUVar22 + 0x40;
                if (local_108 <= pUVar22 + 0x40) {
                  pUVar9 = local_108;
                }
                pUVar16 = pUVar9;
                if (uVar13 != 0) {
                  if (uVar13 == 0xffffffffffffffff) goto LAB_0073476e;
                  uVar19 = (long)pUVar9 - (long)pUVar22;
                  pUVar16 = pUVar22;
                  if (pUVar22 < pUVar9) {
                    uVar21 = (long)pUVar22 << 4 | 8;
                    uVar20 = 0;
                    do {
                      if ((uVar13 >> (uVar20 & 0x3f) & 1) != 0) {
                        left_03.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar21);
                        left_03.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar21);
                        right_02.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar21);
                        right_02.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar21);
                        sVar24 = BinaryLambdaWrapper::
                                 Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                           ((anon_class_8_1_6971b95b)result,left_03,right_02,in_R9,
                                            (idx_t)pUVar9);
                        *(long *)(lVar14 + -8 + uVar21) = sVar24.value._0_8_;
                        *(long *)(lVar14 + uVar21) = sVar24.value._8_8_;
                      }
                      uVar20 = uVar20 + 1;
                      uVar21 = uVar21 + 0x10;
                      pUVar16 = pUVar9;
                    } while (uVar19 != uVar20);
                  }
                }
              }
              pUVar22 = pUVar16;
              uVar12 = uVar12 + 1;
            } while (uVar12 != (ulong)(local_108 + 0x3f) >> 6);
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,local_108);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,local_108);
          duckdb::Vector::SetVectorType(VVar18);
          lVar4 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_b0 == 0 && local_68 == 0) {
            if (local_108 != (UnifiedVectorFormat *)0x0) {
              lVar5 = *local_78;
              iVar17 = *local_c0;
              puVar23 = (undefined8 *)(lVar4 + 8);
              pUVar22 = (UnifiedVectorFormat *)0x0;
              do {
                pUVar9 = pUVar22;
                if (lVar5 != 0) {
                  pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar5 + (long)pUVar22 * 4);
                }
                pUVar16 = pUVar22;
                if (iVar17 != 0) {
                  pUVar16 = (UnifiedVectorFormat *)(ulong)*(uint *)(iVar17 + (long)pUVar22 * 4);
                }
                left_01.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar9 * 0x10);
                left_01.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar9 * 0x10);
                right.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_b8 + 8 + (long)pUVar16 * 0x10);
                right.value._0_8_ = *(undefined8 *)(local_b8 + (long)pUVar16 * 0x10);
                sVar24 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_01,right,in_R9,
                                    in_stack_fffffffffffffee8);
                puVar23[-1] = sVar24.value._0_8_;
                *puVar23 = sVar24.value._8_8_;
                pUVar22 = pUVar22 + 1;
                puVar23 = puVar23 + 2;
              } while (local_108 != pUVar22);
            }
          }
          else if (local_108 != (UnifiedVectorFormat *)0x0) {
            lVar5 = *local_78;
            iVar17 = *local_c0;
            puVar23 = (undefined8 *)(lVar4 + 8);
            pUVar22 = (UnifiedVectorFormat *)0x0;
            idx = iVar17;
            do {
              pUVar9 = pUVar22;
              if (lVar5 != 0) {
                pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar5 + (long)pUVar22 * 4);
              }
              pUVar16 = pUVar22;
              if (iVar17 != 0) {
                pUVar16 = (UnifiedVectorFormat *)(ulong)*(uint *)(iVar17 + (long)pUVar22 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar9 >> 6) * 8) >> ((ulong)pUVar9 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar16 >> 6) * 8) >> ((ulong)pUVar16 & 0x3f) & 1)
                   != 0)))) {
                left_05.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar9 * 0x10);
                left_05.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar9 * 0x10);
                right_04.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_b8 + 8 + (long)pUVar16 * 0x10);
                right_04.value._0_8_ = *(undefined8 *)(local_b8 + (long)pUVar16 * 0x10);
                iVar17 = idx;
                sVar24 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_05,right_04,in_R9,idx);
                puVar23[-1] = sVar24.value._0_8_;
                *puVar23 = sVar24.value._8_8_;
                idx = iVar17;
              }
              else {
                _Var11._M_head_impl = *(unsigned_long **)(result + 0x28);
                if (_Var11._M_head_impl == (unsigned_long *)0x0) {
                  local_c8 = *(unsigned_long *)(result + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_d8,&local_c8);
                  p_Var8 = p_Stack_d0;
                  uVar7 = local_d8;
                  local_d8 = 0;
                  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
                  *(undefined8 *)(result + 0x30) = uVar7;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var8;
                  iVar17 = idx;
                  if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                     iVar17 = idx, p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                     )) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
                    iVar17 = idx;
                  }
                  pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)(result + 0x30));
                  _Var11._M_head_impl =
                       (pTVar10->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(result + 0x28) = _Var11._M_head_impl;
                  idx = iVar17;
                }
                bVar6 = (byte)pUVar22 & 0x3f;
                _Var11._M_head_impl[(ulong)pUVar22 >> 6] =
                     _Var11._M_head_impl[(ulong)pUVar22 >> 6] &
                     (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
              }
              pUVar22 = pUVar22 + 1;
              puVar23 = puVar23 + 2;
            } while (local_108 != pUVar22);
          }
          if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
          }
          if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
          }
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
          }
        }
        return;
      }
      paVar3 = *(anon_union_16_2_67f50693_for_value **)(vector + 0x20);
      lVar4 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar18);
        lVar5 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector_00 + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector_00 + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector_00 + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (local_108 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          aVar25 = paVar3->pointer;
          lVar14 = 8;
          do {
            right_05.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + lVar14);
            right_05.value._0_8_ = *(undefined8 *)(lVar4 + -8 + lVar14);
            sVar24 = BinaryLambdaWrapper::
                     Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,(string_t)aVar25,right_05,in_R9,
                                in_stack_fffffffffffffee8);
            *(long *)(lVar5 + -8 + lVar14) = sVar24.value._0_8_;
            *(long *)(lVar5 + lVar14) = sVar24.value._8_8_;
            lVar14 = lVar14 + 0x10;
            local_108 = local_108 + -1;
          } while (local_108 != (UnifiedVectorFormat *)0x0);
          return;
        }
        if (local_108 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        pUVar22 = (UnifiedVectorFormat *)0x0;
        uVar12 = 0;
        do {
          if (*(long *)(result + 0x28) == 0) {
            pUVar9 = pUVar22 + 0x40;
            if (local_108 <= pUVar22 + 0x40) {
              pUVar9 = local_108;
            }
LAB_00734537:
            pUVar16 = pUVar22;
            if (pUVar22 < pUVar9) {
              aVar25 = paVar3->pointer;
              uVar13 = (long)pUVar22 << 4 | 8;
              do {
                right_01.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar13);
                right_01.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar13);
                sVar24 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,(string_t)aVar25,right_01,in_R9,
                                    (idx_t)pUVar9);
                *(long *)(lVar5 + -8 + uVar13) = sVar24.value._0_8_;
                *(long *)(lVar5 + uVar13) = sVar24.value._8_8_;
                pUVar22 = pUVar22 + 1;
                uVar13 = uVar13 + 0x10;
                pUVar16 = pUVar9;
              } while (pUVar9 != pUVar22);
            }
          }
          else {
            uVar13 = *(ulong *)(*(long *)(result + 0x28) + uVar12 * 8);
            pUVar9 = pUVar22 + 0x40;
            if (local_108 <= pUVar22 + 0x40) {
              pUVar9 = local_108;
            }
            pUVar16 = pUVar9;
            if (uVar13 != 0) {
              if (uVar13 == 0xffffffffffffffff) goto LAB_00734537;
              uVar19 = (long)pUVar9 - (long)pUVar22;
              pUVar16 = pUVar22;
              if (pUVar22 < pUVar9) {
                uVar21 = (long)pUVar22 << 4 | 8;
                uVar20 = 0;
                do {
                  if ((uVar13 >> (uVar20 & 0x3f) & 1) != 0) {
                    right_00.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar21);
                    right_00.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar21);
                    sVar24 = BinaryLambdaWrapper::
                             Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,(string_t)paVar3->pointer,
                                        right_00,in_R9,(idx_t)pUVar9);
                    *(long *)(lVar5 + -8 + uVar21) = sVar24.value._0_8_;
                    *(long *)(lVar5 + uVar21) = sVar24.value._8_8_;
                  }
                  uVar20 = uVar20 + 1;
                  uVar21 = uVar21 + 0x10;
                  pUVar16 = pUVar9;
                } while (uVar19 != uVar20);
              }
            }
          }
          pUVar22 = pUVar16;
          uVar12 = uVar12 + 1;
          if (uVar12 == (ulong)(local_108 + 0x3f) >> 6) {
            return;
          }
        } while( true );
      }
    }
    duckdb::Vector::SetVectorType(VVar18);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void BinaryTrimFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, string_t, string_t>(
	    input.data[0], input.data[1], result, input.size(), [&](string_t input, string_t ignored) {
		    auto data = input.GetData();
		    auto size = input.GetSize();

		    unordered_set<utf8proc_int32_t> ignored_codepoints;
		    GetIgnoredCodepoints(ignored, ignored_codepoints);

		    utf8proc_int32_t codepoint;
		    auto str = reinterpret_cast<const utf8proc_uint8_t *>(data);

		    // Find the first character that is not left trimmed
		    idx_t begin = 0;
		    if (LTRIM) {
			    while (begin < size) {
				    auto bytes =
				        utf8proc_iterate(str + begin, UnsafeNumericCast<utf8proc_ssize_t>(size - begin), &codepoint);
				    if (ignored_codepoints.find(codepoint) == ignored_codepoints.end()) {
					    break;
				    }
				    begin += UnsafeNumericCast<idx_t>(bytes);
			    }
		    }

		    // Find the last character that is not right trimmed
		    idx_t end;
		    if (RTRIM) {
			    end = begin;
			    for (auto next = begin; next < size;) {
				    auto bytes =
				        utf8proc_iterate(str + next, UnsafeNumericCast<utf8proc_ssize_t>(size - next), &codepoint);
				    D_ASSERT(bytes > 0);
				    next += UnsafeNumericCast<idx_t>(bytes);
				    if (ignored_codepoints.find(codepoint) == ignored_codepoints.end()) {
					    end = next;
				    }
			    }
		    } else {
			    end = size;
		    }

		    // Copy the trimmed string
		    auto target = StringVector::EmptyString(result, end - begin);
		    auto output = target.GetDataWriteable();
		    memcpy(output, data + begin, end - begin);

		    target.Finalize();
		    return target;
	    });
}